

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::UnicodeString::tempSubString
          (UnicodeString *__return_storage_ptr__,UnicodeString *this,int32_t start,int32_t len)

{
  ushort uVar1;
  int iVar2;
  int32_t textLength;
  char16_t *pcVar3;
  int iVar4;
  ConstChar16Ptr local_18;
  
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((short)uVar1 < 0) {
    iVar2 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)(short)uVar1 >> 5;
  }
  iVar4 = start;
  if (iVar2 < start) {
    iVar4 = iVar2;
  }
  pcVar3 = (char16_t *)0x0;
  if (start < 0) {
    iVar4 = 0;
  }
  textLength = iVar2 - iVar4;
  if (len <= iVar2 - iVar4) {
    textLength = len;
  }
  if (len < 0) {
    textLength = 0;
  }
  if (((int)(short)uVar1 & 0x11U) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar3 = (this->fUnion).fFields.fArray;
    }
    else {
      pcVar3 = (char16_t *)((long)&this->fUnion + 2);
    }
  }
  if (pcVar3 == (char16_t *)0x0) {
    textLength = -2;
    pcVar3 = (char16_t *)((long)&this->fUnion + 2);
  }
  local_18.p_ = pcVar3 + iVar4;
  UnicodeString(__return_storage_ptr__,'\0',&local_18,textLength);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
UnicodeString::tempSubString(int32_t start, int32_t len) const {
  pinIndices(start, len);
  const UChar *array = getBuffer();  // not getArrayStart() to check kIsBogus & kOpenGetBuffer
  if(array==NULL) {
    array=fUnion.fStackFields.fBuffer;  // anything not NULL because that would make an empty string
    len=-2;  // bogus result string
  }
  return UnicodeString(FALSE, array + start, len);
}